

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufstream.c
# Opt level: O0

err_t BufFlush(bufstream *p)

{
  long local_18;
  err_t Err;
  bufstream *p_local;
  
  local_18 = 0;
  if ((p->Stream != (stream *)0x0) && (p->WritePos != 0)) {
    if (p->Stream == (stream *)0x0) {
      __assert_fail("(const void*)(p->Stream)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/helpers/file/bufstream.c"
                    ,0x1d,"err_t BufFlush(bufstream *)");
    }
    local_18 = (**(code **)((long)(p->Stream->Base).VMT + 0x70))(p->Stream,p->Buffer,p->WritePos,0);
    if (local_18 == 0) {
      p->WritePos = 0;
    }
  }
  return local_18;
}

Assistant:

static NOINLINE err_t BufFlush(bufstream* p)
{
    err_t Err = ERR_NONE;
    if (p->Stream && p->WritePos>0)
    {
        Err = Stream_Write(p->Stream,p->Buffer,p->WritePos,NULL);
        if (Err == ERR_NONE)
            p->WritePos = 0;
    }
    return Err;
}